

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lazy_segtree.cpp
# Opt level: O1

void __thiscall Segtree::unlazy(Segtree *this)

{
  ll *plVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  Segtree *pSVar5;
  int iVar6;
  
  lVar4 = this->lazy;
  this->val = this->val + lVar4;
  iVar2 = this->l;
  iVar3 = this->r;
  if (iVar2 != iVar3) {
    if (this->lson == (Segtree *)0x0) {
      iVar6 = (iVar3 + iVar2) / 2;
      pSVar5 = (Segtree *)operator_new(0x30);
      pSVar5->INF = 1000000000000000000;
      pSVar5->l = iVar2;
      pSVar5->r = iVar6;
      pSVar5->val = 0;
      pSVar5->lazy = 0;
      pSVar5->lson = (Segtree *)0x0;
      pSVar5->rson = (Segtree *)0x0;
      this->lson = pSVar5;
      pSVar5 = (Segtree *)operator_new(0x30);
      pSVar5->INF = 1000000000000000000;
      pSVar5->l = iVar6;
      pSVar5->r = iVar3;
      pSVar5->val = 0;
      pSVar5->lazy = 0;
      pSVar5->lson = (Segtree *)0x0;
      pSVar5->rson = (Segtree *)0x0;
      this->rson = pSVar5;
    }
    plVar1 = &this->lson->lazy;
    *plVar1 = *plVar1 + lVar4;
    plVar1 = &this->rson->lazy;
    *plVar1 = *plVar1 + this->lazy;
    this->lazy = 0;
  }
  return;
}

Assistant:

void unlazy() {
        val += lazy;
        if (l == r) return;
        if(lson == NULL) {
            int mid = (l+r)/2;
            lson = new Segtree(l, mid);
            rson = new Segtree(mid, r);
        }
        lson->lazy += lazy; // <- Propagate
        rson->lazy += lazy;
        lazy = 0;
    }